

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void pstack::print_container<pstack::ReaderArray<Elf64_Rela,42ul>,char_const&>
               (ostream *os,ReaderArray<Elf64_Rela,_42UL> *container,char *ctx)

{
  bool bVar1;
  ostream *os_00;
  JSON<Elf64_Rela,_char> local_68;
  value_type *local_58;
  value_type *field;
  undefined1 auStack_48 [7];
  sentinel __end0;
  iterator __begin0;
  ReaderArray<Elf64_Rela,_42UL> *__range2;
  char *sep;
  char *ctx_local;
  ReaderArray<Elf64_Rela,_42UL> *container_local;
  ostream *os_local;
  
  std::operator<<(os,"[ ");
  __range2 = (ReaderArray<Elf64_Rela,_42UL> *)0x2a9a45;
  _auStack_48 = ReaderArray<Elf64_Rela,_42UL>::begin(container);
  ReaderArray<Elf64_Rela,_42UL>::end(container);
  while( true ) {
    bVar1 = ReaderArray<Elf64_Rela,_42UL>::iterator::operator!=
                      ((iterator *)auStack_48,(sentinel *)((long)&field + 7));
    if (!bVar1) break;
    local_58 = ReaderArray<Elf64_Rela,_42UL>::iterator::operator*((iterator *)auStack_48);
    os_00 = std::operator<<(os,(char *)__range2);
    local_68 = json<Elf64_Rela,char>(local_58,ctx);
    operator<<(os_00,&local_68);
    __range2 = (ReaderArray<Elf64_Rela,_42UL> *)anon_var_dwarf_c456f;
    ReaderArray<Elf64_Rela,_42UL>::iterator::operator++((iterator *)auStack_48);
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}